

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofNonZeroTest_Test::TestBody
          (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofNonZeroTest_Test *this)

{
  TestAllTypes *this_00;
  TestAllTypes *this_01;
  Reflection *pRVar1;
  void *pvVar2;
  undefined4 uVar3;
  FieldDescriptor *pFVar4;
  FieldDescriptor *field;
  Arena *arena;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer *__ptr;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr_10;
  pointer *__ptr_11;
  internal iVar7;
  string_view value;
  string_view field_name;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  string_view name;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l_00;
  string_view name_00;
  AssertHelper local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  AssertHelper local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  this_00 = &(this->super_NoFieldPresenceSwapFieldTest).m1_;
  if ((this->super_NoFieldPresenceSwapFieldTest).m1_.field_0._impl_._oneof_case_[0] != 0x6f) {
    proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field(this_00);
    (this->super_NoFieldPresenceSwapFieldTest).m1_.field_0._impl_._oneof_case_[0] = 0x6f;
  }
  *(undefined4 *)((long)&(this->super_NoFieldPresenceSwapFieldTest).m1_.field_0 + 0x290) = 1;
  this_01 = &(this->super_NoFieldPresenceSwapFieldTest).m2_;
  if ((this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_._oneof_case_[0] != 0x71) {
    proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field(this_01);
    (this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_._oneof_case_[0] = 0x71;
    (this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_.oneof_field_.oneof_nested_message_
         = (TestAllTypes_NestedMessage *)&protobuf::internal::fixed_address_empty_string;
  }
  arena = (Arena *)(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message.super_MessageLite.
                   _internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value._M_str = "test";
  value._M_len = 4;
  protobuf::internal::ArenaStringPtr::Set
            (&(this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_.oneof_field_.
              oneof_string_,value,arena);
  field_name._M_str = "oneof_uint32";
  field_name._M_len = 0xc;
  pFVar4 = NoFieldPresenceSwapFieldTest::FindFieldByName
                     (&this->super_NoFieldPresenceSwapFieldTest,field_name);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r1_;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_48,__l,(allocator_type *)&local_68);
  Reflection::SwapFields
            (pRVar1,&this_00->super_Message,&this_01->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_48);
  pvVar2 = (void *)CONCAT71(local_48._1_7_,local_48[0]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_38._M_allocated_capacity - (long)pvVar2);
  }
  iVar7 = (internal)
          ((this->super_NoFieldPresenceSwapFieldTest).m1_.field_0._impl_._oneof_case_[0] == 0x71);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)iVar7) {
    local_60._M_head_impl._0_1_ = iVar7;
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"m1_.has_oneof_string()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x24f,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  local_60._M_head_impl._0_1_ =
       (internal)
       ((this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_._oneof_case_[0] == 0x6f);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"m2_.has_oneof_uint32()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x250,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r1_;
  name._M_str = "oneof_string";
  name._M_len = 0xc;
  field = Descriptor::FindFieldByName((this->super_NoFieldPresenceSwapFieldTest).d1_,name);
  local_60._M_head_impl._0_1_ = (internal)Reflection::HasField(pRVar1,&this_00->super_Message,field)
  ;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,
               (AssertionResult *)"r1_->HasField(m1_, d1_->FindFieldByName(\"oneof_string\"))",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x251,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  local_60._M_head_impl._0_1_ =
       (internal)
       Reflection::HasField
                 ((this->super_NoFieldPresenceSwapFieldTest).r2_,&this_01->super_Message,pFVar4);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"r2_->HasField(m2_, f)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x252,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  if ((this->super_NoFieldPresenceSwapFieldTest).m1_.field_0._impl_._oneof_case_[0] == 0x71) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(this->super_NoFieldPresenceSwapFieldTest).m1_.field_0._impl_.oneof_field_.
                     oneof_nested_message_ & 0xfffffffffffffffc);
  }
  else {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &protobuf::internal::fixed_address_empty_string;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_48,"m1_.oneof_string()","\"test\"",pbVar5,(char (*) [5])0x142def0);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x253,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  uVar3 = 0;
  if ((this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_._oneof_case_[0] == 0x6f) {
    uVar3 = *(undefined4 *)((long)&(this->super_NoFieldPresenceSwapFieldTest).m2_.field_0 + 0x290);
  }
  local_60._M_head_impl._0_4_ = uVar3;
  local_68.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"m2_.oneof_uint32()","1",(uint *)&local_60,(int *)&local_68);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x254,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r2_;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_60;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_48,__l_00,(allocator_type *)&local_68);
  Reflection::SwapFields
            (pRVar1,&this_00->super_Message,&this_01->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_48);
  pvVar2 = (void *)CONCAT71(local_48._1_7_,local_48[0]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_38._M_allocated_capacity - (long)pvVar2);
  }
  iVar7 = (internal)
          ((this->super_NoFieldPresenceSwapFieldTest).m1_.field_0._impl_._oneof_case_[0] == 0x6f);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)iVar7) {
    local_60._M_head_impl._0_1_ = iVar7;
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"m1_.has_oneof_uint32()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25b,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  local_60._M_head_impl._0_1_ =
       (internal)
       ((this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_._oneof_case_[0] == 0x71);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"m2_.has_oneof_string()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25c,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  local_60._M_head_impl._0_1_ =
       (internal)
       Reflection::HasField
                 ((this->super_NoFieldPresenceSwapFieldTest).r1_,&this_00->super_Message,pFVar4);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"r1_->HasField(m1_, f)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25d,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r2_;
  name_00._M_str = "oneof_string";
  name_00._M_len = 0xc;
  pFVar4 = Descriptor::FindFieldByName((this->super_NoFieldPresenceSwapFieldTest).d2_,name_00);
  local_60._M_head_impl._0_1_ =
       (internal)Reflection::HasField(pRVar1,&this_01->super_Message,pFVar4);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,
               (AssertionResult *)"r2_->HasField(m2_, d2_->FindFieldByName(\"oneof_string\"))",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25e,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  uVar3 = 0;
  if ((this->super_NoFieldPresenceSwapFieldTest).m1_.field_0._impl_._oneof_case_[0] == 0x6f) {
    uVar3 = *(undefined4 *)((long)&(this->super_NoFieldPresenceSwapFieldTest).m1_.field_0 + 0x290);
  }
  local_60._M_head_impl._0_4_ = uVar3;
  local_68.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"m1_.oneof_uint32()","1",(uint *)&local_60,(int *)&local_68);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  if ((this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_._oneof_case_[0] == 0x71) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_.oneof_field_.
                     oneof_nested_message_ & 0xfffffffffffffffc);
  }
  else {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &protobuf::internal::fixed_address_empty_string;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_48,"m2_.oneof_string()","\"test\"",pbVar5,(char (*) [5])0x142def0);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x260,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_F(NoFieldPresenceSwapFieldTest, ReflectionSwapFieldOneofNonZeroTest) {
  m1_.set_oneof_uint32(1);
  m2_.set_oneof_string("test");

  const FieldDescriptor* f = FindFieldByName("oneof_uint32");
  r1_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_TRUE(m1_.has_oneof_string());
  EXPECT_TRUE(m2_.has_oneof_uint32());
  EXPECT_TRUE(r1_->HasField(m1_, d1_->FindFieldByName("oneof_string")));
  EXPECT_TRUE(r2_->HasField(m2_, f));
  EXPECT_EQ(m1_.oneof_string(), "test");
  EXPECT_EQ(m2_.oneof_uint32(), 1);

  // It doesn't matter which reflection or descriptor gets used; swapping should
  // still work if m2_'s descriptor is provided.
  r2_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_TRUE(m1_.has_oneof_uint32());
  EXPECT_TRUE(m2_.has_oneof_string());
  EXPECT_TRUE(r1_->HasField(m1_, f));
  EXPECT_TRUE(r2_->HasField(m2_, d2_->FindFieldByName("oneof_string")));
  EXPECT_EQ(m1_.oneof_uint32(), 1);
  EXPECT_EQ(m2_.oneof_string(), "test");
}